

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PhaseObserver.cpp
# Opt level: O2

void __thiscall PhaseObserver::update(PhaseObserver *this)

{
  int iVar1;
  char *pcVar2;
  Phase PVar3;
  ostream *poVar4;
  Player *pPVar5;
  string *psVar6;
  
  poVar4 = std::operator<<((ostream *)&std::cout,"It is ");
  pPVar5 = (Player *)__dynamic_cast(this->concreteSubject,&Subject::typeinfo,&Player::typeinfo,0);
  psVar6 = Player::getPlayerName_abi_cxx11_(pPVar5);
  poVar4 = std::operator<<(poVar4,(string *)psVar6);
  poVar4 = std::operator<<(poVar4,"\'s turn");
  std::endl<char,std::char_traits<char>>(poVar4);
  pPVar5 = (Player *)__dynamic_cast(this->concreteSubject,&Subject::typeinfo,&Player::typeinfo,0);
  PVar3 = Player::getPhase(pPVar5);
  if (PVar3 < (Buy|Move)) {
    pcVar2 = *(char **)(&DAT_00121c88 + (ulong)PVar3 * 8);
    iVar1 = *(int *)(&DAT_001168b4 + (ulong)PVar3 * 4);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    poVar4 = std::operator<<((ostream *)&std::cout,pcVar2);
    std::endl<char,std::char_traits<char>>(poVar4);
    poVar4 = std::operator<<((ostream *)&std::cout,"| PHASE: ");
    pPVar5 = (Player *)__dynamic_cast(this->concreteSubject,&Subject::typeinfo,&Player::typeinfo,0);
    psVar6 = Player::getPlayerName_abi_cxx11_(pPVar5);
    poVar4 = std::operator<<(poVar4,(string *)psVar6);
    poVar4 = std::operator<<(poVar4,&DAT_001168b4 + iVar1);
    std::endl<char,std::char_traits<char>>(poVar4);
    poVar4 = std::operator<<((ostream *)&std::cout,pcVar2);
    std::endl<char,std::char_traits<char>>(poVar4);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    return;
  }
  return;
}

Assistant:

void PhaseObserver::update() {
    cout << "It is " << dynamic_cast<Player *>(concreteSubject)->getPlayerName() << "'s turn" << endl;

    Player::Phase currentPhase = (dynamic_cast<Player *>(concreteSubject)->getPhase());

    if (currentPhase == Player::Phase::Move) {
        cout << endl;
        cout << "---------------------------------------------------------------------------------------" << endl;
        cout << "| PHASE: " << dynamic_cast<Player*>(concreteSubject)->getPlayerName() << " is rolling. |" << endl;
        cout << "---------------------------------------------------------------------------------------" << endl;
        cout << endl;
    } else if (currentPhase == Player::Phase::Buy) {
        cout << endl;
        cout << "--------------------------------------------------------------------------------------------" << endl;
        cout << "| PHASE: " << dynamic_cast<Player*>(concreteSubject)->getPlayerName() << " is buying cards. |" << endl;
        cout << "--------------------------------------------------------------------------------------------" << endl;
        cout << endl;
    } else if (currentPhase == Player::Phase::Roll){
        cout << endl;
        cout << "-----------------------------------" << endl;
        cout << "| PHASE: " << dynamic_cast<Player*>(concreteSubject)->getPlayerName() << " is rolling. |" << endl;
        cout << "-----------------------------------" << endl;
        cout << endl;


    }

}